

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>
                   (string *__return_storage_ptr__,char (*a) [12],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [6],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [52])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  size_type local_90;
  pointer local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  size_t local_78;
  char (*local_70) [6];
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [52];
  undefined8 local_38;
  
  local_c0.first._M_len = strlen(*a);
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0 = (b->_M_dataplus)._M_p;
  local_a8 = b->_M_string_length;
  local_98 = 0;
  local_88 = (args->_M_dataplus)._M_p;
  local_90 = args->_M_string_length;
  local_c0.first._M_str = *a;
  local_80 = args;
  local_78 = strlen(*args_1);
  local_68 = 0;
  local_58 = (args_2->_M_dataplus)._M_p;
  local_60 = args_2->_M_string_length;
  local_50 = 0;
  local_70 = args_1;
  local_48 = strlen(*args_3);
  local_40 = args_3;
  local_38 = 0;
  views._M_len = 6;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}